

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O0

void __thiscall FParser::OPplus(FParser *this,svalue_t *result,int start,int n,int stop)

{
  uint uVar1;
  fsfix fVar2;
  fsfix fVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  double dVar8;
  undefined1 local_58 [8];
  svalue_t right;
  svalue_t left;
  int stop_local;
  int n_local;
  int start_local;
  svalue_t *result_local;
  FParser *this_local;
  
  left.value._4_4_ = stop;
  svalue_t::svalue_t((svalue_t *)&right.value);
  svalue_t::svalue_t((svalue_t *)local_58);
  EvaluateExpression(this,(svalue_t *)&right.value,start,n + -1);
  EvaluateExpression(this,(svalue_t *)local_58,n + 1,left.value._4_4_);
  if (right.value.i == 0) {
    if (local_58._0_4_ == 0) {
      pcVar6 = FString::GetChars((FString *)&left);
      pcVar7 = FString::GetChars((FString *)&right);
      FString::Format(&result->string,"%s%s",pcVar6,pcVar7);
    }
    else if (local_58._0_4_ == 6) {
      pcVar6 = FString::GetChars((FString *)&left);
      dVar8 = floatvalue((svalue_t *)local_58);
      FString::Format(&result->string,"%s%4.4f",dVar8,pcVar6);
    }
    else {
      pcVar6 = FString::GetChars((FString *)&left);
      uVar1 = intvalue((svalue_t *)local_58);
      FString::Format(&result->string,"%s%i",pcVar6,(ulong)uVar1);
    }
    result->type = 0;
  }
  else if ((right.value.i == 6) || (local_58._0_4_ == 6)) {
    result->type = 6;
    fVar2 = fixedvalue((svalue_t *)&right.value);
    fVar3 = fixedvalue((svalue_t *)local_58);
    (result->value).i = fVar2 + fVar3;
  }
  else {
    result->type = 1;
    iVar4 = intvalue((svalue_t *)&right.value);
    iVar5 = intvalue((svalue_t *)local_58);
    (result->value).i = iVar4 + iVar5;
  }
  svalue_t::~svalue_t((svalue_t *)local_58);
  svalue_t::~svalue_t((svalue_t *)&right.value);
  return;
}

Assistant:

void FParser::OPplus(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
  	if (left.type == svt_string)
    {
      	if (right.type == svt_string)
		{
			result.string.Format("%s%s", left.string.GetChars(), right.string.GetChars());
		}
      	else if (right.type == svt_fixed)
		{
			result.string.Format("%s%4.4f", left.string.GetChars(), floatvalue(right));
		}
      	else
		{
	  		result.string.Format("%s%i", left.string.GetChars(), intvalue(right));
		}
      	result.type = svt_string;
    }
	// haleyjd: 8-17
	else if(left.type == svt_fixed || right.type == svt_fixed)
	{
		result.type = svt_fixed;
		result.value.f = fixedvalue(left) + fixedvalue(right);
	}
	else
	{
		result.type = svt_int;
		result.value.i = intvalue(left) + intvalue(right);
	}
}